

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
           *this,bool value)

{
  type tVar1;
  size_t in_RCX;
  void *in_RDX;
  
  if ((*(long *)(this + 0x10) != 0) && (*(char *)(*(long *)(this + 0x10) + 0x14) != '\0')) {
    tVar1 = operator()(this,(uint)value);
    return (type)tVar1.container;
  }
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            ((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              *)this,(uint)value,in_RDX,in_RCX);
  return (type)*(basic_buffer<char> **)this;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, iterator>::type
      operator()(T value) {
    // MSVC2013 fails to compile separate overloads for bool and char_type so
    // use std::is_same instead.
    if (std::is_same<T, bool>::value) {
      if (specs_ && specs_->type_)
        return (*this)(value ? 1 : 0);
      write(value != 0);
    } else if (std::is_same<T, char_type>::value) {
      internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    } else {
      specs_ ? writer_.write_int(value, *specs_) : writer_.write(value);
    }
    return out();
  }